

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

size_t __thiscall PClassActor::PropagateMark(PClassActor *this)

{
  FState *pFVar1;
  BYTE *pBVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  anon_union_8_2_947301c6 anon_var_0;
  DObject *local_30;
  
  if (0 < this->NumOwnedStates) {
    lVar5 = 8;
    lVar4 = 0;
    do {
      pFVar1 = this->OwnedStates;
      if (*(long *)((long)&pFVar1->NextState + lVar5) != 0) {
        local_30 = *(DObject **)((long)&pFVar1->NextState + lVar5);
        GC::Mark(&local_30);
        *(DObject **)((long)&pFVar1->NextState + lVar5) = local_30;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x28;
    } while (lVar4 < this->NumOwnedStates);
  }
  pBVar2 = (this->super_PClass).Defaults;
  if (pBVar2 != (BYTE *)0x0) {
    local_30 = *(DObject **)(pBVar2 + 0x1b0);
    GC::Mark(&local_30);
    *(DObject **)(pBVar2 + 0x1b0) = local_30;
  }
  sVar3 = PStruct::PropagateMark((PStruct *)this);
  return sVar3;
}

Assistant:

size_t PClassActor::PropagateMark()
{
	// Mark state functions
	for (int i = 0; i < NumOwnedStates; ++i)
	{
		if (OwnedStates[i].ActionFunc != NULL)
		{
			GC::Mark(OwnedStates[i].ActionFunc);
		}
	}
	// Mark damage function
	if (Defaults != NULL)
	{
		GC::Mark(((AActor *)Defaults)->DamageFunc);
	}

//	marked += ActorInfo->NumOwnedStates * sizeof(FState);
	return Super::PropagateMark();
}